

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

int coda_mem_array_set_element(coda_mem_array *type,long index,coda_dynamic_type *element)

{
  coda_dynamic_type *element_local;
  long index_local;
  coda_mem_array *type_local;
  
  if (type == (coda_mem_array *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x27f);
    type_local._4_4_ = -1;
  }
  else if ((index < 0) || (type->num_elements <= index)) {
    coda_set_error(-0x65,"array index (%ld) is not in the range [0,%ld) (%s:%u)",index,
                   type->num_elements,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x285);
    type_local._4_4_ = -1;
  }
  else if (element == (coda_dynamic_type *)0x0) {
    coda_set_error(-100,"element argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x28a);
    type_local._4_4_ = -1;
  }
  else if (type->element[index] == (coda_dynamic_type *)0x0) {
    if (type->definition->base_type == element->definition) {
      type->element[index] = element;
      type_local._4_4_ = 0;
    }
    else {
      coda_set_error(-400,"trying to set array element \'%ld\' of incompatible type (%s:%u)",
                     type->num_elements,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                     ,0x296);
      type_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-100,"array element \'%ld\' is already set (%s:%u)",index,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x290);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_mem_array_set_element(coda_mem_array *type, long index, coda_dynamic_type *element)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (index < 0 || index >= type->num_elements)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "array index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    if (element == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "element argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->element[index] != NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "array element '%ld' is already set (%s:%u)", index, __FILE__,
                       __LINE__);
        return -1;
    }
    if (type->definition->base_type != element->definition)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "trying to set array element '%ld' of incompatible type (%s:%u)",
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    type->element[index] = element;

    return 0;
}